

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  undefined1 uVar1;
  long lVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar3;
  appender aVar4;
  int iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  char cVar15;
  float_specs fVar16;
  int iVar17;
  uint uVar18;
  float_specs fVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  float_specs fVar23;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_8_dbbf3351 write;
  digit_grouping<char> grouping;
  undefined1 local_103 [2];
  undefined8 local_101;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_f8;
  float_specs local_f0;
  float_specs local_e8;
  int local_dc;
  big_decimal_fp *local_d8;
  undefined1 local_d0 [20];
  undefined1 auStack_bc [20];
  float_specs *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_90;
  ulong local_88;
  float_specs local_80;
  float_specs local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_e8 = (float_specs)f->significand;
  iVar5 = f->significand_size;
  local_101._0_1_ = '0';
  local_103[1] = fspecs._5_1_;
  unique0x1000062e = iVar5;
  local_78 = fspecs;
  if (iVar5 < 0) {
LAB_0010e74a:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/core.h"
                ,0x189,"negative value");
  }
  fVar16.precision = (iVar5 + 1) - (uint)(local_103[1] == '\0');
  fVar16._4_4_ = 0;
  local_103[0] = '.';
  uVar11 = fspecs._4_4_;
  uVar12 = (ulong)fspecs >> 0x28;
  fVar19 = fspecs;
  fVar23 = local_e8;
  if ((uVar11 >> 0x11 & 1) != 0) {
    local_f8 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    local_f0 = fspecs;
    local_88 = (ulong)fspecs >> 0x28;
    local_80 = local_e8;
    local_103[0] = decimal_point_impl<char>(loc);
    uVar12 = local_88;
    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_f8.container;
    fVar19 = local_f0;
    fVar23 = local_80;
  }
  uVar13 = auStack_bc._4_8_;
  uVar18 = f->exponent;
  iVar9 = iVar5 + uVar18;
  iVar17 = fVar19.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0010e38b:
    iVar22 = iVar5 + uVar18 + -1;
    if ((uVar11 >> 0x13 & 1) == 0) {
      uVar21 = 0;
      if (iVar5 == 1) {
        local_103[0] = '\0';
        uVar21 = 0;
      }
    }
    else {
      uVar21 = 0;
      if (0 < iVar17 - iVar5) {
        uVar21 = (ulong)(uint)(iVar17 - iVar5);
      }
      fVar16 = (float_specs)((long)fVar16 + uVar21);
    }
    local_d0[0] = (sign_t)uVar12;
    auStack_bc[0] = local_103[0];
    local_d0._16_4_ = iVar5;
    auStack_bc._4_5_ = CONCAT14('0',(int)uVar21);
    auStack_bc._10_2_ = SUB82(uVar13,6);
    auStack_bc._4_8_ =
         CONCAT26(auStack_bc._10_2_,CONCAT15(((uVar11 >> 0x10 & 1) == 0) << 5,auStack_bc._4_5_)) |
         0x450000000000;
    auStack_bc._12_4_ = iVar22;
    local_d0._8_8_ = fVar23;
    if (0 < specs->width) {
      if (iVar9 < 1) {
        iVar22 = 1 - iVar9;
      }
      lVar20 = 2;
      if (99 < iVar22) {
        lVar20 = (ulong)(999 < iVar22) + 3;
      }
      sVar7 = (long)fVar16 + (3 - (ulong)(local_103[0] == '\0')) + lVar20;
      aVar4 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,sVar7,sVar7,(anon_class_40_8_dbbf3351 *)local_d0);
      return (appender)
             aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    uVar1 = local_103[0];
    iVar9 = (int)uVar21;
    if ((sign_t)uVar12 != none) {
      cVar15 = ""[uVar12 & 0xff];
      sVar7 = ((buffer<char> *)
              out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->size_;
      uVar12 = sVar7 + 1;
      if (((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
          )->capacity_ < uVar12) {
        (**((buffer<char> *)
           out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->_vptr_buffer)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        sVar7 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->size_;
        uVar12 = sVar7 + 1;
      }
      ((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->
      size_ = uVar12;
      ((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->
      ptr_[sVar7] = cVar15;
      uVar1 = auStack_bc[0];
      iVar5 = local_d0._16_4_;
      iVar9 = auStack_bc._4_4_;
    }
    bVar3.container =
         (buffer<char> *)
         write_significand<fmt::v10::appender,char>(out,(char *)local_d0._8_8_,iVar5,1,uVar1);
    if (0 < iVar9) {
      bVar3.container =
           (buffer<char> *)
           fill_n<fmt::v10::appender,int,char>((appender)bVar3.container,iVar9,auStack_bc + 8);
    }
    uVar1 = auStack_bc[9];
    sVar7 = (bVar3.container)->size_;
    uVar12 = sVar7 + 1;
    if ((bVar3.container)->capacity_ < uVar12) {
      (**(bVar3.container)->_vptr_buffer)(bVar3.container);
      sVar7 = (bVar3.container)->size_;
      uVar12 = sVar7 + 1;
    }
    (bVar3.container)->size_ = uVar12;
    (bVar3.container)->ptr_[sVar7] = uVar1;
    aVar4 = write_exponent<char,fmt::v10::appender>(auStack_bc._12_4_,(appender)bVar3.container);
    return (appender)
           aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar22 = 0x10;
    if (0 < iVar17) {
      iVar22 = iVar17;
    }
    if ((iVar9 < -3) || (iVar22 < iVar9)) goto LAB_0010e38b;
  }
  local_dc = iVar9;
  if ((int)uVar18 < 0) {
    if (iVar9 < 1) {
      iVar10 = -iVar9;
      iVar22 = iVar10;
      if (SBORROW4(iVar17,iVar10) != iVar17 + iVar9 < 0) {
        iVar22 = iVar17;
      }
      if (iVar17 < 0) {
        iVar22 = iVar10;
      }
      if (iVar5 != 0) {
        iVar22 = iVar10;
      }
      local_70._M_allocated_capacity._0_4_ = iVar22;
      if (iVar5 == 0 && iVar22 == 0) {
        local_101._1_1_ = (char)((uVar11 & 0x80000) >> 0x13);
        iVar5 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
      }
      else {
        local_101._1_1_ = 1;
        iVar5 = 2;
        if (iVar22 < 0) goto LAB_0010e74a;
      }
      sVar7 = (ulong)(uint)(iVar5 + iVar22) + (long)fVar16;
      local_d0._0_8_ = local_103 + 1;
      local_d0._8_8_ = local_103 + 2;
      unique0x00004e80 = (long)&local_101 + 1;
      auStack_bc._4_8_ = local_103;
      auStack_bc._12_8_ = &local_70;
      local_a8 = &local_e8;
      local_a0._M_allocated_capacity = (long)&local_101 + 5;
      aVar4 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                        (out,specs,sVar7,sVar7,(anon_class_56_7_162c6e41 *)local_d0);
      return (appender)
             aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    iVar22 = 0;
    local_101._1_4_ = iVar17 - iVar5 & (int)(uVar11 << 0xc) >> 0x1f;
    uVar18 = local_101._1_4_;
    if ((int)local_101._1_4_ < 1) {
      uVar18 = 0;
    }
    local_f8.container = (buffer<char> *)specs;
    local_f0 = fVar16;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)local_d0,loc,(bool)((byte)(uVar11 >> 0x11) & 1));
    if (local_a8 != (float_specs *)0x0) {
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)(int *)local_d0._8_8_ + local_d0._0_8_);
      lVar20 = 0;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d0._0_8_;
      do {
        if (paVar8 == paVar6) {
          cVar15 = paVar6->_M_local_buf[-1];
          paVar8 = paVar6;
        }
        else {
          cVar15 = paVar8->_M_local_buf[0];
          if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_0010e771;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar8->_M_local_buf + 1);
        }
        iVar22 = iVar22 + cVar15;
        if (iVar9 <= iVar22) goto LAB_0010e771;
        lVar20 = lVar20 + 1;
      } while( true );
    }
    lVar20 = 0;
LAB_0010e771:
    sVar7 = (ulong)uVar18 + (long)local_f0 + lVar20 + 1;
    local_70._M_allocated_capacity = (size_type)(local_103 + 1);
    local_70._8_8_ = &local_e8;
    local_60._M_allocated_capacity = (long)&local_101 + 5;
    local_60._8_8_ = &local_dc;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_103;
    local_40._M_allocated_capacity = (long)&local_101 + 1;
    local_40._8_8_ = local_103 + 2;
    local_48 = (digit_grouping<char> *)local_d0;
    bVar3.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                   (out,local_f8.container,sVar7,sVar7,(anon_class_64_8_e6ffa566 *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_bc._12_8_ != &local_a0) {
      operator_delete((void *)auStack_bc._12_8_,(ulong)(local_a0._M_allocated_capacity + 1));
    }
    uVar13 = stack0xffffffffffffff40;
    uVar14 = local_d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d0 + 0x10)) {
      return (appender)bVar3.container;
    }
  }
  else {
    lVar20 = (ulong)uVar18 + (long)fVar16;
    local_101._1_4_ = iVar17 - iVar9;
    if ((uVar11 >> 0x13 & 1) != 0) {
      lVar20 = lVar20 + 1;
      if (fspecs._4_1_ == '\x02' || 0 < (int)local_101._1_4_) {
        if (0 < (int)local_101._1_4_) {
          lVar20 = lVar20 + (ulong)(uint)local_101._1_4_;
        }
      }
      else {
        local_101._1_4_ = 0;
      }
    }
    local_d8 = f;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar11 >> 0x11) & 1));
    iVar5 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar2 = 0;
      uVar13 = local_70._M_allocated_capacity;
      do {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar13 == paVar8) {
          cVar15 = paVar8->_M_local_buf[-1];
          uVar13 = paVar8;
        }
        else {
          cVar15 = *(char *)uVar13;
          if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_0010e66f;
          uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar13 + 1);
        }
        iVar5 = iVar5 + cVar15;
        if (iVar9 <= iVar5) goto LAB_0010e66f;
        lVar2 = lVar2 + 1;
      } while( true );
    }
    lVar2 = 0;
LAB_0010e66f:
    local_d0._0_8_ = local_103 + 1;
    local_d0._8_8_ = &local_e8;
    unique0x00004e80 = (long)&local_101 + 5;
    auStack_bc._4_8_ = local_d8;
    local_a8 = &local_78;
    local_a0._M_allocated_capacity = (size_type)local_103;
    local_a0._8_8_ = (long)&local_101 + 1;
    local_90 = local_103 + 2;
    auStack_bc._12_8_ = &local_70;
    bVar3.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                   (out,specs,lVar20 + lVar2,lVar20 + lVar2,(anon_class_72_9_0c6a3a8a *)local_d0);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40._M_allocated_capacity + 1);
    }
    uVar13 = local_60._M_allocated_capacity;
    uVar14 = local_70._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_allocated_capacity == &local_60) {
      return (appender)bVar3.container;
    }
  }
  operator_delete((void *)uVar14,uVar13 + 1);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}